

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O2

CURLcode sasl_create_xoauth2_message
                   (SessionHandle *data,char *user,char *bearer,char **outptr,size_t *outlen)

{
  CURLcode CVar1;
  char *__s;
  size_t insize;
  
  __s = curl_maprintf("user=%s\x01auth=Bearer %s\x01\x01");
  if (__s == (char *)0x0) {
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    insize = strlen(__s);
    CVar1 = Curl_base64_encode(data,__s,insize,outptr,outlen);
    (*Curl_cfree)(__s);
  }
  return CVar1;
}

Assistant:

static CURLcode sasl_create_xoauth2_message(struct SessionHandle *data,
                                            const char *user,
                                            const char *bearer,
                                            char **outptr, size_t *outlen)
{
  CURLcode result = CURLE_OK;
  char *xoauth = NULL;

  /* Generate the message */
  xoauth = aprintf("user=%s\1auth=Bearer %s\1\1", user, bearer);
  if(!xoauth)
    return CURLE_OUT_OF_MEMORY;

  /* Base64 encode the reply */
  result = Curl_base64_encode(data, xoauth, strlen(xoauth), outptr, outlen);

  free(xoauth);

  return result;
}